

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hole.c
# Opt level: O0

int copy_source(zip_source_t *from,zip_source_t *to)

{
  char *pcVar1;
  FILE *pFVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  zip_int64_t n;
  zip_uint8_t buf [8192];
  zip_source_t *to_local;
  zip_source_t *from_local;
  
  iVar3 = zip_source_open(from);
  pFVar2 = _stderr;
  pcVar1 = progname;
  if (iVar3 < 0) {
    uVar4 = zip_source_error(from);
    uVar4 = zip_error_strerror(uVar4);
    fprintf(pFVar2,"%s: can\'t open source for reading: %s\n",pcVar1,uVar4);
  }
  else {
    iVar3 = zip_source_begin_write(to);
    pFVar2 = _stderr;
    pcVar1 = progname;
    if (iVar3 < 0) {
      uVar4 = zip_source_error(to);
      uVar4 = zip_error_strerror(uVar4);
      fprintf(pFVar2,"%s: can\'t open source for writing: %s\n",pcVar1,uVar4);
      zip_source_close(from);
    }
    else {
      do {
        lVar5 = zip_source_read(from,&n,0x2000);
        pFVar2 = _stderr;
        pcVar1 = progname;
        if (lVar5 < 1) {
          if (lVar5 < 0) {
            uVar4 = zip_source_error(from);
            uVar4 = zip_error_strerror(uVar4);
            fprintf(pFVar2,"%s: can\'t read from source: %s\n",pcVar1,uVar4);
            zip_source_close(from);
            zip_source_rollback_write(to);
            return -1;
          }
          zip_source_close(from);
          iVar3 = zip_source_commit_write(to);
          pFVar2 = _stderr;
          pcVar1 = progname;
          if (iVar3 < 0) {
            uVar4 = zip_source_error(to);
            uVar4 = zip_error_strerror(uVar4);
            fprintf(pFVar2,"%s: can\'t commit source: %s\n",pcVar1,uVar4);
            zip_source_rollback_write(to);
            return -1;
          }
          return 0;
        }
        lVar6 = zip_source_write(to,&n,lVar5);
        pFVar2 = _stderr;
        pcVar1 = progname;
      } while (lVar6 == lVar5);
      uVar4 = zip_source_error(to);
      uVar4 = zip_error_strerror(uVar4);
      fprintf(pFVar2,"%s: can\'t write to source: %s\n",pcVar1,uVar4);
      zip_source_close(from);
      zip_source_rollback_write(to);
    }
  }
  return -1;
}

Assistant:

static int
copy_source(zip_source_t *from, zip_source_t *to) {
    zip_uint8_t buf[8192];
    zip_int64_t n;

    if (zip_source_open(from) < 0) {
	fprintf(stderr, "%s: can't open source for reading: %s\n", progname, zip_error_strerror(zip_source_error(from)));
	return -1;
    }

    if (zip_source_begin_write(to) < 0) {
	fprintf(stderr, "%s: can't open source for writing: %s\n", progname, zip_error_strerror(zip_source_error(to)));
	zip_source_close(from);
	return -1;
    }

    while ((n = zip_source_read(from, buf, sizeof(buf))) > 0) {
	if (zip_source_write(to, buf, (zip_uint64_t)n) != n) {
	    fprintf(stderr, "%s: can't write to source: %s\n", progname, zip_error_strerror(zip_source_error(to)));
	    zip_source_close(from);
	    zip_source_rollback_write(to);
	    return -1;
	}
    }

    if (n < 0) {
	fprintf(stderr, "%s: can't read from source: %s\n", progname, zip_error_strerror(zip_source_error(from)));
	zip_source_close(from);
	zip_source_rollback_write(to);
	return -1;
    }

    zip_source_close(from);

    if (zip_source_commit_write(to) < 0) {
	fprintf(stderr, "%s: can't commit source: %s\n", progname, zip_error_strerror(zip_source_error(to)));
	zip_source_rollback_write(to);
	return -1;
    }

    return 0;
}